

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O1

int luaV_lessthan(lua_State *L,TValue *l,TValue *r)

{
  uint uVar1;
  
  if ((l->tt_ == 3) && (r->tt_ == 3)) {
    uVar1 = (uint)((l->value_).n <= (r->value_).n && (r->value_).n != (l->value_).n);
  }
  else if (((l->tt_ & 0xfU) == 4) && ((r->tt_ & 0xfU) == 4)) {
    uVar1 = l_strcmp(&((l->value_).gc)->ts,&((r->value_).gc)->ts);
    uVar1 = uVar1 >> 0x1f;
  }
  else {
    uVar1 = call_orderTM(L,l,r,TM_LT);
    if ((int)uVar1 < 0) {
      luaG_ordererror(L,l,r);
    }
  }
  return uVar1;
}

Assistant:

int luaV_lessthan (lua_State *L, const TValue *l, const TValue *r) {
  int res;
  if (ttisnumber(l) && ttisnumber(r))
    return luai_numlt(L, nvalue(l), nvalue(r));
  else if (ttisstring(l) && ttisstring(r))
    return l_strcmp(rawtsvalue(l), rawtsvalue(r)) < 0;
  else if ((res = call_orderTM(L, l, r, TM_LT)) < 0)
    luaG_ordererror(L, l, r);
  return res;
}